

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall
QWidgetPrivate::setGeometry_sys(QWidgetPrivate *this,int x,int y,int w,int h,bool isMove)

{
  undefined1 *puVar1;
  uint uVar2;
  QWidget *this_00;
  QWExtra *pQVar3;
  QWidgetData *pQVar4;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  char cVar10;
  int iVar11;
  QWidgetPrivate *d;
  long lVar12;
  int extraout_var;
  QPoint QVar13;
  _Head_base<0UL,_QTLWExtra_*,_false> _Var14;
  int extraout_EDX;
  int extraout_var_00;
  Representation RVar15;
  QWidget *parent;
  Representation RVar16;
  QRect *pQVar17;
  int iVar18;
  long in_FS_OFFSET;
  bool bVar19;
  QRegion updateRegion;
  QPoint oldPos;
  QSize olds;
  QSize local_70;
  QPoint local_68;
  QSize local_60;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  QWidget *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  pQVar3 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar3 != (QWExtra *)0x0) {
    if (pQVar3->maxw < w) {
      w = pQVar3->maxw;
    }
    if (pQVar3->maxh < h) {
      h = pQVar3->maxh;
    }
    if (w <= pQVar3->minw) {
      w = pQVar3->minw;
    }
    if (h <= pQVar3->minh) {
      h = pQVar3->minh;
    }
  }
  if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
    lVar12 = *(long *)(*(long *)&this_00->field_0x8 + 0x78);
    if (lVar12 == 0) {
      lVar12 = 0;
    }
    else {
      lVar12 = *(long *)(lVar12 + 8);
    }
    if (((lVar12 != 0) && (*(long *)(lVar12 + 0x20) != 0)) &&
       (cVar10 = (**(code **)(*QGuiApplicationPrivate::platform_integration + 0x10))
                           (QGuiApplicationPrivate::platform_integration,10), cVar10 == '\0')) {
      iVar11 = QWindow::geometry();
      w = (extraout_EDX - iVar11) + 1;
      QWindow::geometry();
      h = (extraout_var_00 - extraout_var) + 1;
      y = 0;
      x = 0;
    }
  }
  pQVar4 = this_00->data;
  iVar11 = (pQVar4->crect).x1.m_i;
  iVar18 = (pQVar4->crect).y1.m_i;
  RVar15.m_i = ((pQVar4->crect).x2.m_i - iVar11) + 1;
  RVar16.m_i = ((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i) + 1;
  local_60.ht.m_i = RVar16.m_i;
  local_60.wd.m_i = RVar15.m_i;
  bVar6 = RVar16.m_i != h;
  bVar7 = RVar15.m_i != w;
  bVar19 = bVar6 || bVar7;
  if (!isMove) {
    isMove = iVar18 != y || iVar11 != x;
  }
  if (((w == RVar15.m_i) && (h == RVar16.m_i)) && (iVar18 == y && iVar11 == x)) goto LAB_003080f4;
  iVar18 = w + x + -1;
  iVar11 = h + y + -1;
  if (((this->data).field_0x11 & 8) == 0) {
    pQVar4->field_0x10 = pQVar4->field_0x10 & 0xfd;
    puVar1 = &this_00->data->field_0x10;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffffb;
    if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      createTLExtra(this);
      _Var5.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
           (((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
           super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
      *(undefined8 *)
       ((long)_Var5.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
              super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa0) = 0;
      *(undefined8 *)
       ((long)_Var5.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
              super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa8) = 0xfffffffefffffffe;
    }
  }
  local_68 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = QWidget::pos(this_00);
  (this->data).crect.x1.m_i = x;
  (this->data).crect.y1.m_i = y;
  (this->data).crect.x2.m_i = iVar18;
  (this->data).crect.y2.m_i = iVar11;
  pQVar4 = this_00->data;
  if (((pQVar4->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    lVar12 = *(long *)(*(long *)&this_00->field_0x8 + 0x78);
    if (lVar12 == 0) {
      lVar12 = 0;
    }
    else {
      lVar12 = *(long *)(lVar12 + 8);
    }
    if ((lVar12 != 0) && (*(long *)(lVar12 + 0x20) != 0)) goto LAB_00307cbb;
LAB_00307d53:
    bVar9 = false;
  }
  else {
LAB_00307cbb:
    if ((((this->data).field_0x10 & 4) == 0) && ((w == 0 || (h == 0)))) {
      uVar2 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
      if ((uVar2 >> 0x11 & 1) == 0) {
        *(uint *)(*(long *)&this_00->field_0x8 + 0x240) = uVar2 | 0x20000;
      }
      if ((pQVar4->widget_attributes & 0x8000) != 0) {
        hide_sys(this);
      }
      (this->data).crect.x1.m_i = x;
      (this->data).crect.y1.m_i = y;
      (this->data).crect.x2.m_i = iVar18;
      (this->data).crect.y2.m_i = iVar11;
      goto LAB_00307d53;
    }
    uVar2 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
    if ((uVar2 >> 0x11 & 1) == 0) {
      bVar9 = false;
    }
    else {
      *(uint *)(*(long *)&this_00->field_0x8 + 0x240) = uVar2 & 0xfffdffff;
      bVar9 = true;
    }
  }
  if ((this_00->data->widget_attributes & 0x8000) == 0) {
    if (isMove != false) {
      QVar13 = QWidget::pos(this_00);
      if ((local_68.xp.m_i != QVar13.xp.m_i.m_i) || (local_68.yp.m_i != QVar13.yp.m_i.m_i)) {
        uVar2 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
        if ((uVar2 & 4) == 0) {
          *(uint *)(*(long *)&this_00->field_0x8 + 0x240) = uVar2 | 4;
        }
      }
    }
    if (bVar19) {
      uVar2 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
      if ((uVar2 & 8) == 0) {
        *(uint *)(*(long *)&this_00->field_0x8 + 0x240) = uVar2 | 8;
      }
    }
  }
  else {
    lVar12 = *(long *)&this_00->field_0x8;
    if (((*(byte *)(lVar12 + 0x248) & 0x80) == 0) && ((*(byte *)(lVar12 + 0x242) & 2) == 0)) {
      if (*(long *)(lVar12 + 0x78) == 0) {
        lVar12 = 0;
      }
      else {
        lVar12 = *(long *)(*(long *)(lVar12 + 0x78) + 8);
      }
      if (lVar12 == 0) {
        pQVar17 = (QRect *)0x0;
      }
      else {
        pQVar17 = *(QRect **)(lVar12 + 0x20);
      }
      if (pQVar17 != (QRect *)0x0) {
        parent = this_00;
        if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
          do {
            parent = *(QWidget **)(*(long *)&parent->field_0x8 + 0x10);
            if (parent == (QWidget *)0x0) break;
          } while (parent->data->winid == 0);
          local_58._0_4_ = 0;
          local_58._4_4_ = 0;
          local_58 = (undefined1  [8])QWidget::mapTo(this_00,parent,(QPoint *)local_58);
          uStack_50 = (undefined1 *)CONCAT44(local_58._4_4_ + h + -1,w + local_58._0_4_ + -1);
LAB_00307e74:
          QWindow::setGeometry(pQVar17);
        }
        else if (bVar19 && isMove == false) {
          QWindow::resize((int)pQVar17,w);
        }
        else {
          if (isMove != true || (bVar6 || bVar7)) goto LAB_00307e74;
          QWindow::setPosition((int)pQVar17,x);
        }
        if (bVar9) {
          show_sys(this);
        }
      }
      if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        if ((this->field_0x253 & 1) == 0) {
          if (isMove == true && (!bVar6 && !bVar7)) {
            uStack_50 = (undefined1 *)
                        CONCAT44(local_60.ht.m_i.m_i + local_68.yp.m_i.m_i + -1,
                                 local_60.wd.m_i.m_i + local_68.xp.m_i.m_i + -1);
            local_58._0_4_ = local_68.xp.m_i;
            local_58._4_4_ = local_68.yp.m_i;
            moveRect(this,(QRect *)local_58,x - local_68.xp.m_i,y - local_68.yp.m_i);
          }
          else {
            invalidateBackingStore_resizeHelper(this,&local_68,&local_60);
          }
        }
        else {
          local_70 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion((QRegion *)&local_70,&this_00->data->crect,Rectangle);
          uStack_50 = (undefined1 *)
                      CONCAT44(local_60.ht.m_i.m_i + local_68.yp.m_i.m_i + -1,
                               local_60.wd.m_i.m_i + local_68.xp.m_i.m_i + -1);
          local_58._0_4_ = local_68.xp.m_i;
          local_58._4_4_ = local_68.yp.m_i;
          QRegion::operator+=((QRegion *)&local_70,(QRect *)local_58);
          invalidateBackingStore<QRegion>
                    (*(QWidgetPrivate **)(*(long *)(*(long *)&this_00->field_0x8 + 0x10) + 8),
                     (QRegion *)&local_70);
          QRegion::~QRegion((QRegion *)&local_70);
        }
      }
    }
    if (isMove != false) {
      local_48 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = (QSize)QWidget::pos(this_00);
      QMoveEvent::QMoveEvent((QMoveEvent *)local_58,(QPoint *)&local_70,&local_68);
      QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)local_58);
      QMoveEvent::~QMoveEvent((QMoveEvent *)local_58);
    }
    if (bVar19) {
      local_70.ht.m_i = h;
      local_70.wd.m_i = w;
      local_48 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QResizeEvent::QResizeEvent((QResizeEvent *)local_58,&local_70,&local_60);
      QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)local_58);
      pQVar3 = ((*(QWidgetPrivate **)&this_00->field_0x8)->extra)._M_t.
               super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
      if (pQVar3 == (QWExtra *)0x0) {
        _Var14._M_head_impl = (QTLWExtra *)0x0;
      }
      else {
        _Var14._M_head_impl =
             *(QTLWExtra **)
              &(pQVar3->topextra)._M_t.
               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
      }
      if (((_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>)_Var14._M_head_impl !=
           (QTLWExtra *)0x0) && (*(long *)((long)_Var14._M_head_impl + 0x20) != 0)) {
        pQVar4 = this_00->data;
        auVar8._4_4_ = (pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i;
        auVar8._0_4_ = (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i;
        auVar8._8_8_ = 0;
        update<QRect>(*(QWidgetPrivate **)&this_00->field_0x8,(QRect)(auVar8 << 0x40));
      }
      QResizeEvent::~QResizeEvent((QResizeEvent *)local_58);
    }
  }
  cVar10 = QAccessible::isActive();
  if ((cVar10 != '\0') && ((this_00->data->widget_attributes & 0x8000) != 0)) {
    local_58 = (undefined1  [8])QFont::strikeOut;
    uStack_50 = (undefined1 *)0xaaaaaaaa0000800b;
    puStack_40 = (undefined1 *)0xaaaaaaaaffffffff;
    local_48 = this_00;
    QAccessible::updateAccessibility((QAccessibleEvent *)local_58);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)local_58);
  }
LAB_003080f4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setGeometry_sys(int x, int y, int w, int h, bool isMove)
{
    Q_Q(QWidget);
    if (extra) {                                // any size restrictions?
        w = qMin(w,extra->maxw);
        h = qMin(h,extra->maxh);
        w = qMax(w,extra->minw);
        h = qMax(h,extra->minh);
    }

    if (q->isWindow() && q->windowHandle()) {
        QPlatformIntegration *integration = QGuiApplicationPrivate::platformIntegration();
        if (!integration->hasCapability(QPlatformIntegration::NonFullScreenWindows)) {
            x = 0;
            y = 0;
            w = q->windowHandle()->width();
            h = q->windowHandle()->height();
        }
    }

    QPoint oldp = q->geometry().topLeft();
    QSize olds = q->size();
    QRect r(x, y, w, h);

    bool isResize = olds != r.size();
    if (!isMove)
        isMove = oldp != r.topLeft();


    // We only care about stuff that changes the geometry, or may
    // cause the window manager to change its state
    if (r.size() == olds && oldp == r.topLeft())
        return;

    if (!data.in_set_window_state) {
        q->data->window_state &= ~Qt::WindowMaximized;
        q->data->window_state &= ~Qt::WindowFullScreen;
        if (q->isWindow())
            topData()->normalGeometry = QRect(0, 0, -1, -1);
    }

    QPoint oldPos = q->pos();
    data.crect = r;

    bool needsShow = false;

    if (q->isWindow() || q->windowHandle()) {
        if (!(data.window_state & Qt::WindowFullScreen) && (w == 0 || h == 0)) {
            q->setAttribute(Qt::WA_OutsideWSRange, true);
            if (q->isVisible())
                hide_sys();
            data.crect = QRect(x, y, w, h);
        } else if (q->testAttribute(Qt::WA_OutsideWSRange)) {
            q->setAttribute(Qt::WA_OutsideWSRange, false);
            needsShow = true;
        }
    }

    if (q->isVisible()) {
        if (!q->testAttribute(Qt::WA_DontShowOnScreen) && !q->testAttribute(Qt::WA_OutsideWSRange)) {
            if (QWindow *win = q->windowHandle()) {
                if (q->isWindow()) {
                    if (isResize && !isMove)
                        win->resize(w, h);
                    else if (isMove && !isResize)
                        win->setPosition(x, y);
                    else
                        win->setGeometry(q->geometry());
                } else {
                    QPoint posInNativeParent =  q->mapTo(q->nativeParentWidget(),QPoint());
                    win->setGeometry(QRect(posInNativeParent,r.size()));
                }

                if (needsShow)
                    show_sys();
            }

            if (!q->isWindow()) {
                if (renderToTexture) {
                    QRegion updateRegion(q->geometry());
                    updateRegion += QRect(oldPos, olds);
                    q->parentWidget()->d_func()->invalidateBackingStore(updateRegion);
                } else if (isMove && !isResize) {
                    moveRect(QRect(oldPos, olds), x - oldPos.x(), y - oldPos.y());
                } else {
                    invalidateBackingStore_resizeHelper(oldPos, olds);
                }
            }
        }

        if (isMove) {
            QMoveEvent e(q->pos(), oldPos);
            QCoreApplication::sendEvent(q, &e);
        }
        if (isResize) {
            QResizeEvent e(r.size(), olds);
            QCoreApplication::sendEvent(q, &e);
            if (q->windowHandle())
                q->update();
        }
    } else { // not visible
        if (isMove && q->pos() != oldPos)
            q->setAttribute(Qt::WA_PendingMoveEvent, true);
        if (isResize)
            q->setAttribute(Qt::WA_PendingResizeEvent, true);
    }

#if QT_CONFIG(accessibility)
    if (QAccessible::isActive() && q->isVisible()) {
        QAccessibleEvent event(q, QAccessible::LocationChanged);
        QAccessible::updateAccessibility(&event);
    }
#endif
}